

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O3

void free_timer(JSRuntime *rt,JSOSTimer *th)

{
  int iVar1;
  int64_t iVar2;
  JSValueUnion JVar3;
  JSValue v;
  
  iVar2 = (th->func).tag;
  if (0xfffffff4 < (uint)iVar2) {
    JVar3 = (JSValueUnion)(th->func).u.ptr;
    iVar1 = *JVar3.ptr;
    *(int *)JVar3.ptr = iVar1 + -1;
    if (iVar1 < 2) {
      v.tag = iVar2;
      v.u.ptr = JVar3.ptr;
      __JS_FreeValueRT(rt,v);
    }
  }
  js_free_rt(rt,th);
  return;
}

Assistant:

static void free_timer(JSRuntime *rt, JSOSTimer *th)
{
    JS_FreeValueRT(rt, th->func);
    js_free_rt(rt, th);
}